

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialSums.h
# Opt level: O3

ulint __thiscall bwtil::PartialSums::getCount(PartialSums *this,symbol s)

{
  byte bVar1;
  byte bVar2;
  pointer puVar3;
  ulong uVar4;
  sbyte sVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  undefined7 in_register_00000031;
  ulong uVar9;
  
  if ((int)CONCAT71(in_register_00000031,s) != 0) {
    bVar1 = this->d;
    bVar2 = this->log2n;
    puVar3 = (this->nodes).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
             .super__Vector_impl_data._M_start;
    uVar7 = (uint)((byte)(s - 1) / bVar1) + ((uint)this->nr_of_nodes - (uint)this->nr_of_leafs);
    sVar5 = (bVar2 < 0x41) * ('@' - bVar2);
    uVar9 = ((puVar3[uVar7] >>
             ((ulong)((~(uint)((byte)(s - 1) % bVar1) + (uint)bVar1) * (uint)bVar2) & 0x3f)) <<
            sVar5) >> sVar5;
    if (uVar7 != 0) {
      uVar7 = uVar7 & 0xffff;
      do {
        uVar4 = (long)(int)(uVar7 - 1) % (long)(int)(bVar1 + 1);
        uVar8 = (uint)uVar4;
        uVar6 = (int)(~uVar8 + uVar7) / (int)(bVar1 + 1);
        uVar7 = uVar6 & 0xffff;
        if ((uVar4 & 0xff) != 0) {
          uVar9 = uVar9 + (puVar3[uVar7] >>
                           ((ulong)(((uint)bVar1 - (uVar8 & 0xff)) * (uint)bVar2) & 0x3f) &
                          ~(-1L << ((ulong)bVar2 & 0x3f)));
        }
      } while ((short)uVar6 != 0);
    }
    return this->base_counter + uVar9;
  }
  return (ulong)this->base_counter;
}

Assistant:

ulint getCount(symbol s){

	#ifdef DEBUG
		if(empty){
			cout << "ERROR (PartialSums): getCount() called on empty counter\n";
			exit(0);
		}
	#endif

		if(s==0)
			return base_counter;

		s--;

	#ifdef DEBUG
		if(s>=sigma){
			cout << "ERROR (PartialSums): symbol " << s << " not in alphabet.\n";
			exit(0);
		}
	#endif

		uint current_node = (nr_of_nodes - nr_of_leafs) + (s/d);//offset leafs + leaf number

		uint offset_in_node = s%d;//number of the counter inside the node

		ulint count = getCounterNumber(nodes[current_node],offset_in_node);

		while(current_node>0){//repeat while current node is not the root

			offset_in_node = childNumber(current_node);
			current_node = parent(current_node);

			if(offset_in_node>0)
				count += getCounterNumber(nodes[current_node],offset_in_node-1);

		}

		return count + base_counter;

	}